

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O3

void __thiscall
Refal2::CArbitraryInteger::subFromBigger(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  uint uVar1;
  pointer puVar2;
  uint *puVar3;
  uint in_EAX;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  ulong __new_size;
  pointer puVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uStack_18;
  
  uVar4 = (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __new_size = (long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  if (__new_size < uVar4) {
    __new_size = uVar4;
  }
  uStack_18 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,__new_size,
             (value_type *)((long)&uStack_18 + 4));
  puVar7 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = 0;
    do {
      if (puVar5 == puVar3) {
        __assert_fail("i != end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x155,
                      "void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
      }
      uVar6 = uVar8 + *puVar7;
      uVar1 = *puVar5;
      uVar8 = (uint)(uVar1 < uVar6);
      uVar9 = (uVar1 - uVar6) + 0x1000000;
      if (uVar1 >= uVar6) {
        uVar9 = uVar1 - uVar6;
      }
      *puVar5 = uVar9;
      puVar7 = puVar7 + 1;
      puVar5 = puVar5 + 1;
    } while (puVar7 != puVar2);
    if (uVar1 < uVar6) {
      do {
        if (puVar5 == (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          __assert_fail("i != end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                        ,0x162,
                        "void Refal2::CArbitraryInteger::subFromBigger(const CArbitraryInteger &)");
        }
        if (*puVar5 != 0) {
          *puVar5 = *puVar5 - 1;
          return;
        }
        puVar5 = puVar5 + 1;
      } while (uVar1 < uVar6);
    }
  }
  return;
}

Assistant:

void CArbitraryInteger::subFromBigger( const CArbitraryInteger& operand )
{
	resize( std::max( size(), operand.size() ), 0 );
	iterator i = begin();
	const_iterator j = operand.cbegin();
	bool take = false;
	while( j != operand.cend() ) {
		assert( i != end() );
		TDigit sub = *j + ( take ? 1 : 0 );
		if( *i < sub ) {
			*i += Base - sub;
			take = true;
		} else {
			*i -= sub;
			take = false;
		}
		++j;
		++i;
	}
	while( take ) {
		assert( i != end() );
		if( *i > 0 ) {
			( *i )--;
			take = false;
		}
		++i;
	}
}